

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O0

uint64_t capnp::compiler::generateMethodParamsId
                   (uint64_t parentId,uint16_t methodOrdinal,bool isResults)

{
  byte *pbVar1;
  uint local_f4;
  ulong uStack_f0;
  uint i_2;
  uint64_t result;
  ArrayPtr<const_unsigned_char> resultBytes;
  undefined1 local_c4 [8];
  TypeIdGenerator generator;
  uint i_1;
  uint i;
  byte bytes [11];
  bool isResults_local;
  uint16_t methodOrdinal_local;
  uint64_t parentId_local;
  
  bytes[3] = isResults;
  bytes._4_2_ = methodOrdinal;
  unique0x1000013c = parentId;
  memset((void *)((long)&i_1 + 2),0,0xb);
  for (generator.ctx.block[0xf] = 0; generator.ctx.block[0xf] < 8;
      generator.ctx.block[0xf] = generator.ctx.block[0xf] + 1) {
    *(char *)((long)&i_1 + (ulong)generator.ctx.block[0xf] + 2) =
         (char)(stack0xfffffffffffffff0 >> ((byte)(generator.ctx.block[0xf] << 3) & 0x3f));
  }
  for (generator.ctx.block[0xe] = 0; generator.ctx.block[0xe] < 2;
      generator.ctx.block[0xe] = generator.ctx.block[0xe] + 1) {
    bytes[generator.ctx.block[0xe]] =
         (byte)((int)(uint)(ushort)bytes._4_2_ >> ((byte)(generator.ctx.block[0xe] << 3) & 0x1f));
  }
  bytes[2] = bytes[3] & 1;
  TypeIdGenerator::TypeIdGenerator((TypeIdGenerator *)local_c4);
  kj::ArrayPtr<unsigned_char_const>::ArrayPtr<11ul>
            ((ArrayPtr<unsigned_char_const> *)&resultBytes.size_,(uchar (*) [11])((long)&i_1 + 2));
  TypeIdGenerator::update((TypeIdGenerator *)local_c4,stack0xffffffffffffff28);
  _result = TypeIdGenerator::finish((TypeIdGenerator *)local_c4);
  uStack_f0 = 0;
  for (local_f4 = 0; local_f4 < 8; local_f4 = local_f4 + 1) {
    pbVar1 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&result,(ulong)local_f4);
    uStack_f0 = uStack_f0 << 8 | (ulong)*pbVar1;
  }
  return uStack_f0 | 0x8000000000000000;
}

Assistant:

uint64_t generateMethodParamsId(uint64_t parentId, uint16_t methodOrdinal, bool isResults) {
  // Compute ID by hashing the concatenation of the parent ID, the method ordinal, and a
  // boolean indicating whether this is the params or the results, and then taking the first 8
  // bytes.

  kj::byte bytes[sizeof(uint64_t) + sizeof(uint16_t) + 1]{};
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    bytes[i] = (parentId >> (i * 8)) & 0xff;
  }
  for (uint i = 0; i < sizeof(uint16_t); i++) {
    bytes[sizeof(uint64_t) + i] = (methodOrdinal >> (i * 8)) & 0xff;
  }
  bytes[sizeof(bytes) - 1] = isResults;

  TypeIdGenerator generator;
  generator.update(bytes);

  kj::ArrayPtr<const kj::byte> resultBytes = generator.finish();

  uint64_t result = 0;
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    result = (result << 8) | resultBytes[i];
  }

  return result | (1ull << 63);
}